

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O2

void OrderTree(QuadTreeNode *Tree,int PostTree)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  
  if (Tree->Children == (QuadTreeNode *)0x0) {
    if (*(int **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4) != (int *)0x0)
    {
      piVar3 = (int *)0x0;
      piVar5 = (int *)0x0;
      piVar4 = *(int **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4);
      while (piVar4 != (int *)0x0) {
        piVar6 = piVar5;
        piVar1 = piVar4;
        piVar2 = piVar3;
        if (piVar4[2] == 1) {
          piVar6 = piVar4;
          piVar1 = piVar3;
          piVar2 = piVar5;
        }
        piVar3 = piVar1;
        piVar1 = *(int **)piVar4;
        *(int **)piVar4 = piVar2;
        piVar5 = piVar6;
        piVar4 = piVar1;
      }
      *(int **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4) = piVar5;
      piVar4 = (int *)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4);
      for (; piVar5 != (int *)0x0; piVar5 = *(int **)piVar5) {
        piVar4 = piVar5;
      }
      *(int **)piVar4 = piVar3;
    }
  }
  else {
    for (lVar7 = 0xd8; lVar7 != -0x48; lVar7 = lVar7 + -0x48) {
      OrderTree((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar7),PostTree);
    }
  }
  return;
}

Assistant:

void OrderTree(struct QuadTreeNode *Tree, int PostTree)
{
   struct Container *Objects, *NonObjects, *P, *PNext, **ITree;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         OrderTree(&Tree->Children[c], PostTree);
   } else {
      ITree = PostTree ? &Tree->PostContents : &Tree->Contents;

      if (*ITree) {
         /* separate object and non-oject lists */
         Objects = NonObjects = NULL;
         P = *ITree;
         while (P) {
            PNext = P->Next;

            if (P->Type == OBJECT) {
               P->Next = Objects;
               Objects = P;
            } else {
               P->Next = NonObjects;
               NonObjects = P;
            }

            P = PNext;
         }

         /* now reintegrate lists - objects then non-objects */
         *ITree = Objects;
         while (*ITree)
            ITree = &(*ITree)->Next;
         *ITree = NonObjects;
      }
   }
}